

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin>
               (GetterXsYs<int> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar5->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    iVar10 = *(int *)((long)getter->Ys + lVar9);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar6 = log10((double)*(int *)((long)getter->Xs + lVar9) / (pIVar5->XAxis).Range.Min);
    pIVar5 = pIVar7->CurrentPlot;
    dVar3 = (pIVar5->XAxis).Range.Min;
    iVar11 = transformer->YAxis;
    local_3c.y = (float)(((double)iVar10 - pIVar5->YAxis[iVar11].Range.Min) * pIVar7->My[iVar11] +
                        (double)pIVar7->PixelRange[iVar11].Min.y);
    local_3c.x = (float)((((double)(float)(dVar6 / pIVar7->LogDenX) *
                           ((pIVar5->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar7->Mx +
                        (double)pIVar7->PixelRange[iVar11].Min.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLin> *)local_58,
               local_60,&pIVar5->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    iVar10 = *(int *)((long)getter->Ys + lVar9);
    dVar6 = log10((double)*(int *)((long)getter->Xs + lVar9) / (pIVar5->XAxis).Range.Min);
    pIVar5 = pIVar7->CurrentPlot;
    dVar3 = (pIVar5->XAxis).Range.Min;
    iVar11 = transformer->YAxis;
    local_58._4_4_ =
         (float)(((double)iVar10 - pIVar5->YAxis[iVar11].Range.Min) * pIVar7->My[iVar11] +
                (double)pIVar7->PixelRange[iVar11].Min.y);
    local_58._0_4_ =
         (float)((((double)(float)(dVar6 / pIVar7->LogDenX) * ((pIVar5->XAxis).Range.Max - dVar3) +
                  dVar3) - dVar3) * pIVar7->Mx + (double)pIVar7->PixelRange[iVar11].Min.x);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar8 = GImPlot;
        lVar9 = (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                (long)getter->Stride;
        iVar10 = *(int *)((long)getter->Ys + lVar9);
        dVar6 = log10((double)*(int *)((long)getter->Xs + lVar9) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar5 = pIVar8->CurrentPlot;
        dVar3 = (pIVar5->XAxis).Range.Min;
        iVar4 = transformer->YAxis;
        fVar12 = (float)((((double)(float)(dVar6 / pIVar8->LogDenX) *
                           ((pIVar5->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar8->Mx +
                        (double)pIVar8->PixelRange[iVar4].Min.x);
        fVar13 = (float)(((double)iVar10 - pIVar5->YAxis[iVar4].Range.Min) * pIVar8->My[iVar4] +
                        (double)pIVar8->PixelRange[iVar4].Min.y);
        local_68.y = fVar13;
        local_68.x = fVar12;
        pIVar5 = pIVar7->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar2 = fVar13;
        }
        if ((fVar2 < (pIVar5->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                           local_58._4_4_ & -(uint)(fVar13 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar2 = fVar12;
          }
          if ((fVar2 < (pIVar5->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12 |
                             local_58._0_4_ & -(uint)(fVar12 <= (float)local_58._0_4_)),
             (pIVar5->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}